

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnns_index.h
# Opt level: O0

void __thiscall
gnns::Gnns_Index<L2Distance<float>_>::build_index
          (Gnns_Index<L2Distance<float>_> *this,string *graph_index_path,string *graph_dist_path,
          bool rebuild)

{
  exception *e;
  bool rebuild_local;
  string *graph_dist_path_local;
  string *graph_index_path_local;
  Gnns_Index<L2Distance<float>_> *this_local;
  
  if (rebuild) {
    Knn_Graph<L2Distance<float>_>::build_graph
              (&this->graph,&this->points,this->vec_len,this->k,this->method);
    Knn_Graph<L2Distance<float>_>::save_graph(&this->graph,graph_index_path,graph_dist_path);
  }
  else {
    Knn_Graph<L2Distance<float>_>::load_graph(&this->graph,graph_index_path,graph_dist_path);
  }
  return;
}

Assistant:

void build_index(const std::string& graph_index_path, const std::string& graph_dist_path, bool rebuild=false)
        {
            if(rebuild)
            {
                graph.build_graph(points, vec_len, k, method);
                graph.save_graph(graph_index_path, graph_dist_path);
            }
            else
            {
                try{
                    graph.load_graph(graph_index_path, graph_dist_path);
                }catch(std::exception& e){
                    std::cout << "The saved graph is not exist and building a graph, this may cost lots of time..." << std::endl;
                    graph.build_graph(points, vec_len, k, method);
                    graph.save_graph(graph_index_path, graph_dist_path);
                }
            }
        }